

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_strip_flags_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char **in_RSI;
  allocator local_35;
  int local_34;
  char **local_30;
  string local_28;
  
  local_30 = in_RSI;
  std::__cxx11::string::string((string *)&local_28,"Usage message",&local_35);
  gflags::SetUsageMessage(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  gflags::ParseCommandLineFlags(&local_34,&local_30,false);
  puts(*local_30);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  SetUsageMessage("Usage message");
  ParseCommandLineFlags(&argc, &argv, false);

  // Unfortunately, for us, libtool can replace executables with a shell
  // script that does some work before calling the 'real' executable
  // under a different name.  We need the 'real' executable name to run
  // 'strings' on it, so we construct this binary to print the real
  // name (argv[0]) on stdout when run.
  puts(argv[0]);

  return 0;
}